

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fputs.c
# Opt level: O0

int fputs(char *__s,FILE *__stream)

{
  char *pcVar1;
  _PDCLIB_fd_t _Var2;
  int iVar3;
  _PDCLIB_file_t *stream_local;
  char *s_local;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  iVar3 = _PDCLIB_prepwrite((_PDCLIB_file_t *)__stream);
  stream_local = (_PDCLIB_file_t *)__s;
  if (iVar3 == -1) {
    mtx_unlock((mtx_t *)&__stream->_IO_save_base);
    s_local._4_4_ = -1;
  }
  else {
    for (; (char)stream_local->handle != '\0';
        stream_local = (_PDCLIB_file_t *)((long)&stream_local->handle + 1)) {
      _Var2 = stream_local->handle;
      pcVar1 = __stream->_IO_read_base;
      __stream->_IO_read_base = pcVar1 + 1;
      __stream->_IO_read_ptr[(long)pcVar1] = (char)_Var2;
      if (((__stream->_IO_read_base == __stream->_IO_read_end) ||
          ((((ulong)__stream->_IO_buf_end & 0x200000000) != 0 &&
           ((char)stream_local->handle == '\n')))) &&
         (iVar3 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream), iVar3 == -1)) {
        mtx_unlock((mtx_t *)&__stream->_IO_save_base);
        return -1;
      }
    }
    if ((((ulong)__stream->_IO_buf_end & 0x400000000) == 0) ||
       (iVar3 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream), iVar3 != -1)) {
      mtx_unlock((mtx_t *)&__stream->_IO_save_base);
      s_local._4_4_ = 0;
    }
    else {
      mtx_unlock((mtx_t *)&__stream->_IO_save_base);
      s_local._4_4_ = -1;
    }
  }
  return s_local._4_4_;
}

Assistant:

int fputs( const char * _PDCLIB_restrict s, struct _PDCLIB_file_t * _PDCLIB_restrict stream )
{
    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepwrite( stream ) == EOF )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        return EOF;
    }

    while ( *s != '\0' )
    {
        /* Unbuffered and line buffered streams get flushed when fputs() does
           write the terminating end-of-line. All streams get flushed if the
           buffer runs full.
        */
        stream->buffer[ stream->bufidx++ ] = *s;

        if ( ( stream->bufidx == stream->bufsize ) ||
             ( ( stream->status & _IOLBF ) && *s == '\n' )
           )
        {
            if ( _PDCLIB_flushbuffer( stream ) == EOF )
            {
                _PDCLIB_UNLOCK( stream->mtx );
                return EOF;
            }
        }

        ++s;
    }

    if ( stream->status & _IONBF )
    {
        if ( _PDCLIB_flushbuffer( stream ) == EOF )
        {
            _PDCLIB_UNLOCK( stream->mtx );
            return EOF;
        }
    }

    _PDCLIB_UNLOCK( stream->mtx );

    return 0;
}